

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O3

bool __thiscall SF_XORDecode::setDecodeParms(SF_XORDecode *this,QPDFObjectHandle *decode_parms)

{
  long lVar1;
  uchar *puVar2;
  shared_ptr<Buffer> buf;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/KeyStream","");
  QPDFObjectHandle::getKey(local_50);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_60);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  lVar1 = Buffer::getSize();
  if (lVar1 == 1) {
    puVar2 = (uchar *)Buffer::getBuffer();
    this->key = *puVar2;
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return lVar1 == 1;
}

Assistant:

bool
SF_XORDecode::setDecodeParms(QPDFObjectHandle decode_parms)
{
    // For purposes of example, we store the key in a separate stream. We could just as well store
    // the key directly in /DecodeParms, but this example uses a stream to illustrate how one might
    // do that. For example, if implementing /JBIG2Decode, one would need to handle the
    // /JBIG2Globals key, which points to a stream. See comments in SF_XORDecode::registerStream for
    // additional notes on this.
    try {
        // Expect /DecodeParms to be a dictionary with a /KeyStream key that points to a one-byte
        // stream whose single byte is the key. If we are successful at retrieving the key, return
        // true, indicating that we are able to process with the given decode parameters. Under any
        // other circumstances, return false. For other examples of QPDFStreamFilter
        // implementations, look at the classes whose names start with SF_ in the qpdf library
        // implementation.
        auto buf = decode_parms.getKey("/KeyStream").getStreamData();
        if (buf->getSize() != 1) {
            return false;
        }
        this->key = buf->getBuffer()[0];
        return true;
    } catch (std::exception& e) {
        std::cerr << "Error extracting key for /XORDecode: " << e.what() << std::endl;
    }
    return false;
}